

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O3

void __thiscall QScrollBar::wheelEvent(QScrollBar *this,QWheelEvent *event)

{
  QScrollBarPrivate *this_00;
  bool bVar1;
  ushort uVar2;
  uint delta;
  Orientation OVar3;
  uint uVar4;
  Orientation orientation;
  uint uVar5;
  uint uVar6;
  
  event[0xc] = (QWheelEvent)0x0;
  uVar4 = (uint)*(undefined8 *)(event + 0x58);
  uVar5 = uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = -uVar4;
  }
  delta = (uint)((ulong)*(undefined8 *)(event + 0x58) >> 0x20);
  uVar6 = -delta;
  if (0 < (int)delta) {
    uVar6 = delta;
  }
  if (uVar6 < uVar5) {
    orientation = Horizontal;
    delta = -uVar4;
  }
  else {
    orientation = Vertical;
    if (uVar4 != 0) {
      OVar3 = QAbstractSlider::orientation(&this->super_QAbstractSlider);
      if (OVar3 == Horizontal) {
        return;
      }
      delta = *(uint *)(event + 0x5c);
    }
  }
  this_00 = *(QScrollBarPrivate **)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
  bVar1 = QAbstractSliderPrivate::scrollByDelta
                    (&this_00->super_QAbstractSliderPrivate,orientation,
                     (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
                     *(QFlagsStorage<Qt::KeyboardModifier> *)(event + 0x20),delta);
  if (bVar1) {
    event[0xc] = (QWheelEvent)0x1;
  }
  uVar2 = *(ushort *)(event + 0x4e) >> 0xc & 7;
  if (uVar2 == 1) {
    bVar1 = false;
  }
  else {
    if (uVar2 != 3) {
      return;
    }
    bVar1 = true;
  }
  QScrollBarPrivate::setTransient(this_00,bVar1);
  return;
}

Assistant:

void QScrollBar::wheelEvent(QWheelEvent *event)
{
    event->ignore();
    bool horizontal = qAbs(event->angleDelta().x()) > qAbs(event->angleDelta().y());
    // The vertical wheel can be used to scroll a horizontal scrollbar, but only if
    // there is no simultaneous horizontal wheel movement.  This is to avoid chaotic
    // scrolling on touchpads.
    if (!horizontal && event->angleDelta().x() != 0 && orientation() == Qt::Horizontal)
        return;
    // scrollbar is a special case - in vertical mode it reaches minimum
    // value in the upper position, however QSlider's minimum value is on
    // the bottom. So we need to invert the value, but since the scrollbar is
    // inverted by default, we need to invert the delta value only for the
    // horizontal orientation.
    int delta = horizontal ? -event->angleDelta().x() : event->angleDelta().y();
    Q_D(QScrollBar);
    if (d->scrollByDelta(horizontal ? Qt::Horizontal : Qt::Vertical, event->modifiers(), delta))
        event->accept();

    if (event->phase() == Qt::ScrollBegin)
        d->setTransient(false);
    else if (event->phase() == Qt::ScrollEnd)
        d->setTransient(true);
}